

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

void __thiscall
mjs::native_error_exception::native_error_exception
          (native_error_exception *this,native_error_type type,wstring_view *stack_trace,
          wstring_view *msg)

{
  wstring_view *pwVar1;
  wstring_view *in_R8;
  allocator<wchar_t> local_56;
  allocator<wchar_t> local_55 [13];
  string local_48;
  wstring_view *local_28;
  wstring_view *msg_local;
  wstring_view *stack_trace_local;
  native_error_exception *pnStack_10;
  native_error_type type_local;
  native_error_exception *this_local;
  
  local_28 = msg;
  msg_local = stack_trace;
  stack_trace_local._4_4_ = type;
  pnStack_10 = this;
  (anonymous_namespace)::get_eval_exception_repr_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)(ulong)type,(native_error_type)stack_trace,msg,in_R8
            );
  eval_exception::runtime_error(&this->super_eval_exception,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pwVar1 = local_28;
  *(undefined ***)&this->super_eval_exception = &PTR__native_error_exception_00304128;
  this->type_ = stack_trace_local._4_4_;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->msg_,pwVar1,local_55);
  std::allocator<wchar_t>::~allocator(local_55);
  pwVar1 = msg_local;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->stack_trace_,pwVar1,&local_56);
  std::allocator<wchar_t>::~allocator(&local_56);
  return;
}

Assistant:

native_error_exception::native_error_exception(native_error_type type, const std::wstring_view& stack_trace, const std::wstring_view& msg)
    : eval_exception{get_eval_exception_repr(type, stack_trace, msg)}
    , type_{type}
    , msg_{msg}
    , stack_trace_{stack_trace} {
}